

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

bool pbrt::ParseArg<int*>
               (char ***argv,string *name,int *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char **ppcVar1;
  char *__s;
  bool bVar2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string value;
  string arg;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,**argv,(allocator<char> *)&value);
  if (arg._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
  }
  else {
    std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
  }
  std::__cxx11::string::operator=((string *)&arg,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  anon_unknown_14::normalizeArg(&value,&arg);
  std::operator+(&local_50,name,'=');
  anon_unknown_14::normalizeArg(&local_b0,&local_50);
  bVar2 = anon_unknown_14::matchPrefix(&value,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&value);
  if (bVar2) {
    *argv = *argv + 1;
    std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
    bVar2 = anon_unknown_14::initArg(&value,out);
    if (!bVar2) {
      StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_70,(pbrt *)"invalid value \"%s\" for %s argument",(char *)&value,name,in_R8)
      ;
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()(onError,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&value);
  }
  else {
    anon_unknown_14::normalizeArg(&value,&arg);
    anon_unknown_14::normalizeArg(&local_b0,name);
    _Var3 = std::operator==(&value,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&value);
    if (_Var3) {
      ppcVar1 = *argv;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ppcVar1 + 1);
      *argv = (char **)args;
      __s = ppcVar1[1];
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&value,__s,(allocator<char> *)&local_b0);
        anon_unknown_14::initArg(&value,out);
        std::__cxx11::string::~string((string *)&value);
        *argv = *argv + 1;
        bVar2 = true;
        goto LAB_002f8c94;
      }
      StringPrintf<std::__cxx11::string&>
                (&local_90,(pbrt *)"missing value after %s argument",(char *)&arg,args);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()(onError,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    bVar2 = false;
  }
LAB_002f8c94:
  std::__cxx11::string::~string((string *)&arg);
  return bVar2;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}